

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

int yy_array_var(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,1,0,"yyPush");
  iVar4 = G->pos;
  iVar5 = G->thunkpos;
  yyText(G,G->begin,G->end);
  G->begin = G->pos;
  iVar3 = yymatchChar(G,0x40);
  if ((iVar3 == 0) || (iVar3 = yy_varname(G), iVar3 == 0)) {
    G->pos = iVar4;
    G->thunkpos = iVar5;
    iVar4 = yymatchChar(G,0x40);
    iVar5 = 4;
    if ((iVar4 != 0) && (iVar4 = yy_scalar(G), iVar4 != 0)) {
      iVar5 = 0;
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_2_array_var,G->begin,G->end,"yy_2_array_var");
    }
  }
  else {
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yyDo(G,yy_1_array_var,G->begin,G->pos,"yy_1_array_var");
    iVar5 = 3;
  }
  if (iVar5 != 0) {
    if (iVar5 == 4) {
      G->pos = iVar1;
      G->thunkpos = iVar2;
      return 0;
    }
    if (iVar5 != 3) {
      return iVar1;
    }
  }
  yyDo(G,yyPop,1,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_array_var(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 1, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "array_var"));

  {  int yypos224= G->pos, yythunkpos224= G->thunkpos;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l225;  if (!yymatchChar(G, '@')) goto l225;
  if (!yy_varname(G))  goto l225;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l225;  yyDo(G, yy_1_array_var, G->begin, G->end, "yy_1_array_var");
  goto l224;
  l225:;	  G->pos= yypos224; G->thunkpos= yythunkpos224;  if (!yymatchChar(G, '@')) goto l223;
  if (!yy_scalar(G))  goto l223;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_2_array_var, G->begin, G->end, "yy_2_array_var");

  }
  l224:;	  yyprintf((stderr, "  ok   array_var"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 1, 0, "yyPop");
  return 1;
  l223:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "array_var"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}